

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meanfield_cpu.cpp
# Opt level: O3

void __thiscall MeanField::CPU::CRF::filterGaussian(CRF *this,float *unaries)

{
  float fVar1;
  uint uVar2;
  float *pfVar3;
  void *pvVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  int y;
  long lVar9;
  size_t sVar10;
  float *pfVar11;
  int i_1;
  float *pfVar12;
  ulong uVar13;
  int i;
  ulong uVar14;
  int iVar15;
  float fVar16;
  ulong local_68;
  long local_60;
  int local_48;
  
  iVar15 = this->height;
  if (this->separable == false) {
    if (0 < iVar15) {
      iVar6 = this->width;
      y = 0;
      do {
        if (0 < iVar6) {
          iVar15 = 0;
          do {
            Filtering::applyGaussianKernel
                      ((this->spatialKernel)._M_t.
                       super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                       super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                       super__Head_base<0UL,_float_*,_false>._M_head_impl,unaries,
                       (this->gaussianOut)._M_t.
                       super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                       super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                       super__Head_base<0UL,_float_*,_false>._M_head_impl,this->spatialSD,
                       this->dimensions,iVar15,y,iVar6,this->height);
            iVar15 = iVar15 + 1;
            iVar6 = this->width;
          } while (iVar15 < iVar6);
          iVar15 = this->height;
        }
        y = y + 1;
      } while (y < iVar15);
    }
  }
  else if (0 < iVar15) {
    uVar14 = (ulong)(uint)this->width;
    iVar6 = 0;
    do {
      if (0 < (int)uVar14) {
        lVar9 = 0;
        do {
          pfVar11 = (this->filterOutTmp)._M_t.
                    super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                    super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                    super__Head_base<0UL,_float_*,_false>._M_head_impl;
          pfVar3 = (this->spatialKernel)._M_t.
                   super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                   super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                   super__Head_base<0UL,_float_*,_false>._M_head_impl;
          fVar16 = this->spatialSD;
          uVar2 = this->dimensions;
          lVar8 = (long)(int)uVar2;
          uVar13 = (ulong)uVar2;
          sVar10 = uVar13 * 4;
          if (lVar8 < 0) {
            sVar10 = 0xffffffffffffffff;
          }
          pvVar4 = operator_new__(sVar10);
          if (0 < lVar8) {
            memset(pvVar4,0,uVar13 * 4);
          }
          uVar5 = (uint)fVar16;
          if (-1 < (int)uVar5) {
            lVar7 = (long)(int)-uVar5;
            local_48 = (int)uVar14;
            pfVar12 = unaries + ((iVar6 * local_48 + lVar9) - (long)(int)uVar5) * lVar8;
            fVar16 = 0.0;
            do {
              if ((-1 < lVar7 + lVar9) && (lVar7 + lVar9 < (long)local_48)) {
                fVar1 = pfVar3[(ulong)uVar5 - lVar7];
                fVar16 = fVar16 + fVar1;
                if (0 < (int)uVar2) {
                  uVar14 = 0;
                  do {
                    *(float *)((long)pvVar4 + uVar14 * 4) =
                         pfVar12[uVar14] * fVar1 + *(float *)((long)pvVar4 + uVar14 * 4);
                    uVar14 = uVar14 + 1;
                  } while (uVar13 != uVar14);
                }
              }
              lVar7 = lVar7 + 1;
              pfVar12 = pfVar12 + lVar8;
            } while (uVar5 + 1 != (int)lVar7);
            if ((0 < (int)uVar2) && (0.0 < fVar16)) {
              uVar14 = 0;
              do {
                pfVar11[(long)(int)((iVar6 * local_48 + (int)lVar9) * uVar2) + uVar14] =
                     *(float *)((long)pvVar4 + uVar14 * 4) / fVar16;
                uVar14 = uVar14 + 1;
              } while (uVar13 != uVar14);
            }
          }
          operator_delete__(pvVar4);
          lVar9 = lVar9 + 1;
          uVar14 = (ulong)this->width;
        } while (lVar9 < (long)uVar14);
        iVar15 = this->height;
      }
      iVar6 = iVar6 + 1;
    } while (iVar6 < iVar15);
    if (0 < iVar15) {
      local_68 = (ulong)(uint)this->width;
      lVar9 = 0;
      do {
        if (0 < (int)local_68) {
          local_60 = 0;
          do {
            pfVar11 = (this->filterOutTmp)._M_t.
                      super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                      super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                      super__Head_base<0UL,_float_*,_false>._M_head_impl;
            pfVar3 = (this->gaussianOut)._M_t.
                     super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                     super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                     super__Head_base<0UL,_float_*,_false>._M_head_impl;
            pfVar12 = (this->spatialKernel)._M_t.
                      super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                      super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                      super__Head_base<0UL,_float_*,_false>._M_head_impl;
            fVar16 = this->spatialSD;
            uVar2 = this->dimensions;
            lVar8 = (long)(int)uVar2;
            uVar14 = (ulong)uVar2;
            iVar15 = this->height;
            sVar10 = uVar14 * 4;
            if (lVar8 < 0) {
              sVar10 = 0xffffffffffffffff;
            }
            pvVar4 = operator_new__(sVar10);
            if (0 < lVar8) {
              memset(pvVar4,0,uVar14 * 4);
            }
            uVar5 = (uint)fVar16;
            if (-1 < (int)uVar5) {
              lVar7 = (long)(int)-uVar5;
              pfVar11 = pfVar11 + ((lVar9 - (int)uVar5) * (long)(int)local_68 + local_60) * lVar8;
              fVar16 = 0.0;
              do {
                if ((-1 < lVar7 + lVar9) && (lVar7 + lVar9 < (long)iVar15)) {
                  fVar1 = pfVar12[(ulong)uVar5 - lVar7];
                  fVar16 = fVar16 + fVar1;
                  if (0 < (int)uVar2) {
                    uVar13 = 0;
                    do {
                      *(float *)((long)pvVar4 + uVar13 * 4) =
                           pfVar11[uVar13] * fVar1 + *(float *)((long)pvVar4 + uVar13 * 4);
                      uVar13 = uVar13 + 1;
                    } while (uVar14 != uVar13);
                  }
                }
                lVar7 = lVar7 + 1;
                pfVar11 = pfVar11 + (int)local_68 * lVar8;
              } while (uVar5 + 1 != (int)lVar7);
              if ((0 < (int)uVar2) && (0.0 < fVar16)) {
                uVar13 = 0;
                do {
                  pfVar3[(long)(int)(((int)local_68 * (int)lVar9 + (int)local_60) * uVar2) + uVar13]
                       = *(float *)((long)pvVar4 + uVar13 * 4) / fVar16;
                  uVar13 = uVar13 + 1;
                } while (uVar14 != uVar13);
              }
            }
            operator_delete__(pvVar4);
            local_60 = local_60 + 1;
            local_68 = (ulong)this->width;
          } while (local_60 < (long)local_68);
          iVar15 = this->height;
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 < iVar15);
    }
  }
  return;
}

Assistant:

void CRF::filterGaussian(const float *unaries) {
    if (!separable) {
        for (int i = 0; i < height; i++) {
            for (int j = 0; j < width; j++) {
                applyGaussianKernel(spatialKernel.get(), unaries, gaussianOut.get(), spatialSD, dimensions, j, i, width, height);
            }
        }
    }
    else {
        for (int i = 0; i < height; i++) {
            for (int j = 0; j < width; j++) {
                applyGaussianKernelX(unaries, filterOutTmp.get(), spatialKernel.get(), spatialSD,
                    dimensions, j, i, width, height);
            }
        }

        for (int i = 0; i < height; i++) {
            for (int j = 0; j < width; j++) {
                applyGaussianKernelY(filterOutTmp.get(), gaussianOut.get(), spatialKernel.get(), spatialSD,
                    dimensions, j, i, width, height);
            }
        }
    }
}